

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathParser.cpp
# Opt level: O0

bool __thiscall MathExpression::check(MathExpression *this)

{
  bool bVar1;
  MathExpression *this_local;
  
  bVar1 = CheckPostfix(&this->postfix,(bool)(this->allowLabels & 1));
  if (bVar1) {
    bVar1 = CExpressionCommandList::Load(&this->expList,&this->postfix);
    if (bVar1) {
      this->checked = true;
      this_local._7_1_ = true;
    }
    else {
      Logger::printError<std::__cxx11::wstring>
                (Error,L"Invalid expression \"%s\"",&this->originalText);
      this_local._7_1_ = false;
    }
  }
  else {
    Logger::printError<std::__cxx11::wstring>
              (Error,L"Invalid expression \"%s\"",&this->originalText);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MathExpression::check()
{
	if (CheckPostfix(postfix,allowLabels) == false)
	{
		Logger::printError(Logger::Error,L"Invalid expression \"%s\"",originalText);
		return false;
	}

	if (expList.Load(postfix) == false)
	{
		Logger::printError(Logger::Error,L"Invalid expression \"%s\"",originalText);
		return false;
	}
	
	checked = true;
	return true;
}